

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O3

void __thiscall Fossilize::ZipDatabase::~ZipDatabase(ZipDatabase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  mz_bool mVar4;
  LogLevel LVar5;
  ZipDatabase *pZVar6;
  long lVar7;
  
  (this->super_DatabaseInterface)._vptr_DatabaseInterface = (_func_int **)&PTR__ZipDatabase_001689f8
  ;
  if (this->alive == true) {
    if (this->mode != ReadOnly) {
      mVar4 = mz_zip_writer_finalize_archive(&this->mz);
      if (mVar4 == 0) {
        LVar5 = get_thread_log_level();
        if ((int)LVar5 < 3) {
          pZVar6 = (ZipDatabase *)0x2;
          bVar3 = Internal::log_thread_callback(LOG_ERROR,"Failed to finalize archive.\n");
          if (!bVar3) {
            ~ZipDatabase(pZVar6);
          }
        }
      }
    }
    mVar4 = mz_zip_end(&this->mz);
    if (mVar4 == 0) {
      LVar5 = get_thread_log_level();
      if ((int)LVar5 < 3) {
        pZVar6 = (ZipDatabase *)0x2;
        bVar3 = Internal::log_thread_callback(LOG_ERROR,"mz_zip_end failed!\n");
        if (!bVar3) {
          ~ZipDatabase(pZVar6);
        }
      }
    }
  }
  lVar7 = 0x298;
  do {
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)((long)&(this->super_DatabaseInterface)._vptr_DatabaseInterface + lVar7));
    lVar7 = lVar7 + -0x38;
  } while (lVar7 != 0x68);
  pcVar2 = (this->path)._M_dataplus._M_p;
  paVar1 = &(this->path).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  DatabaseInterface::~DatabaseInterface(&this->super_DatabaseInterface);
  return;
}

Assistant:

~ZipDatabase()
	{
		if (alive)
		{
			if (mode != DatabaseMode::ReadOnly)
			{
				if (!mz_zip_writer_finalize_archive(&mz))
					LOGE_LEVEL("Failed to finalize archive.\n");
			}

			if (!mz_zip_end(&mz))
				LOGE_LEVEL("mz_zip_end failed!\n");
		}
	}